

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenOptionalDecl_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GenTypeBasic_abi_cxx11_(&local_30,this,type,true);
  std::operator+(&local_50,"::flatbuffers::Optional<",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,">");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenOptionalDecl(const Type &type) {
    return "::flatbuffers::Optional<" + GenTypeBasic(type, true) + ">";
  }